

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DETECT_STAIRS(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  _Bool _Var2;
  loc_conflict grid_00;
  loc_conflict grid;
  wchar_t wStack_24;
  _Bool stairs;
  wchar_t y2;
  wchar_t y1;
  wchar_t x2;
  wchar_t x1;
  wchar_t y;
  wchar_t x;
  effect_handler_context_t_conflict *context_local;
  
  bVar1 = false;
  wStack_24 = (player->grid).y - context->y;
  grid.y = (player->grid).y + context->y;
  y1 = (player->grid).x - context->x;
  y2 = (player->grid).x + context->x;
  if (wStack_24 < L'\0') {
    wStack_24 = L'\0';
  }
  if (y1 < L'\0') {
    y1 = L'\0';
  }
  if (cave->height + L'\xffffffff' < grid.y) {
    grid.y = cave->height + L'\xffffffff';
  }
  if (cave->width + L'\xffffffff' < y2) {
    y2 = cave->width + L'\xffffffff';
  }
  for (x2 = wStack_24; x2 < grid.y; x2 = x2 + L'\x01') {
    for (x1 = y1; x1 < y2; x1 = x1 + L'\x01') {
      grid_00 = (loc_conflict)loc(x1,x2);
      _Var2 = square_in_bounds_fully((chunk *)cave,grid_00);
      if ((_Var2) && (_Var2 = square_isstairs((chunk *)cave,grid_00), _Var2)) {
        square_memorize((chunk *)cave,grid_00);
        square_light_spot((chunk *)cave,(loc)grid_00);
        bVar1 = true;
      }
    }
  }
  if (bVar1) {
    msg("You sense the presence of stairs!");
  }
  else if ((context->aware & 1U) != 0) {
    msg("You sense no stairs.");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_STAIRS(effect_handler_context_t *context)
{
	int x, y;
	int x1, x2, y1, y2;

	bool stairs = false;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Detect stairs */
			if (square_isstairs(cave, grid)) {
				/* Memorize */
				square_memorize(cave, grid);
				square_light_spot(cave, grid);

				/* Obvious */
				stairs = true;
			}
		}
	}

	/* Describe */
	if (stairs)
		msg("You sense the presence of stairs!");
	else if (context->aware)
		msg("You sense no stairs.");

	context->ident = true;
	return true;
}